

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

Var Js::CrossSite::CrossSiteProxyCallTrap(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  int in_stack_00000010;
  Arguments local_30;
  
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1c2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00760e66;
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(function);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1c3,"(VarIs<JavascriptProxy>(function))",
                                "VarIs<JavascriptProxy>(function)");
    if (!bVar2) {
LAB_00760e66:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_30.Values = (Type)&stack0x00000018;
  local_30.Info = callInfo;
  pvVar4 = CommonThunk(function,JavascriptProxy::FunctionCallTrap,&local_30);
  return pvVar4;
}

Assistant:

Var CrossSite::CrossSiteProxyCallTrap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        RUNTIME_ARGUMENTS(args, callInfo);
        Assert(VarIs<JavascriptProxy>(function));

        return CrossSite::CommonThunk(function, JavascriptProxy::FunctionCallTrap, args);
    }